

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O1

char * VulkanUtilities::VkImageLayoutToString(VkImageLayout Layout)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if ((int)Layout < 0x3b9acdea) {
    switch(Layout) {
    case VK_IMAGE_LAYOUT_UNDEFINED:
      pcVar1 = "VK_IMAGE_LAYOUT_UNDEFINED";
      break;
    case VK_IMAGE_LAYOUT_GENERAL:
      pcVar1 = "VK_IMAGE_LAYOUT_GENERAL";
      break;
    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
      pcVar1 = "VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL";
      break;
    case VK_IMAGE_LAYOUT_PREINITIALIZED:
      pcVar1 = "VK_IMAGE_LAYOUT_PREINITIALIZED";
      break;
    default:
      goto switchD_0025cca8_default;
    }
  }
  else {
    if ((int)Layout < 0x3b9c9308) {
      if (Layout == VK_IMAGE_LAYOUT_PRESENT_SRC_KHR) {
        return "VK_IMAGE_LAYOUT_PRESENT_SRC_KHR";
      }
      if (Layout == VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR) {
        return "VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR";
      }
    }
    else {
      if (Layout == VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL) {
        return "VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL";
      }
      if (Layout == VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL) {
        return "VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL";
      }
    }
switchD_0025cca8_default:
    Diligent::FormatString<char[15]>(&local_28,(char (*) [15])"Unknown layout");
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"VkImageLayoutToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x2cc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* VkImageLayoutToString(VkImageLayout Layout)
{
    switch (Layout)
    {
        // clang-format off
#define IMAGE_LAYOUT_TO_STRING(LAYOUT)case LAYOUT: return #LAYOUT;
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_UNDEFINED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_GENERAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PREINITIALIZED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PRESENT_SRC_KHR)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR)
#undef IMAGE_LAYOUT_TO_STRING
        default: UNEXPECTED("Unknown layout"); return "";
            // clang-format on
    }
}